

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionGenerator.cpp
# Opt level: O1

void __thiscall InstructionGenerator::genCloneTop(InstructionGenerator *this,string *varName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  Compiler *this_00;
  bool bVar3;
  uint stackPos;
  int iVar4;
  long *plVar5;
  Variable *pVVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  size_type *psVar7;
  uint uVar8;
  string arrayName;
  string arrayIndex;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pcVar2 = (varName->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + varName->_M_string_length);
  stackPos = VirtualStack::isVariable(&this->super_VirtualStack,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((int)stackPos < 0) {
    __return_storage_ptr__ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         __cxa_allocate_exception(0x20);
    std::operator+(&local_f0,"Undefined variable \'",varName);
    std::operator+(__return_storage_ptr__,&local_f0,"\'");
    __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string
               );
  }
  bVar3 = Parser::isArrayDefinition(&this->parser,varName);
  if (bVar3) {
    local_f0._M_string_length = 0;
    local_f0.field_2._M_local_buf[0] = '\0';
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    pcVar2 = (varName->_M_dataplus)._M_p;
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar2,pcVar2 + varName->_M_string_length);
    Parser::splitArrayDefinition(&this->parser,&local_90,&local_f0,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    paVar1 = &local_110.field_2;
    local_110._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"");
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,local_f0._M_dataplus._M_p,
               local_f0._M_dataplus._M_p + local_f0._M_string_length);
    iVar4 = VirtualStack::isVariable(&this->super_VirtualStack,&local_b0);
    genCreateInt(this,&local_110,iVar4 + 1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar1) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    this_00 = this->compiler;
    std::operator+(&local_110,"(",&local_70);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_110);
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_d0.field_2._M_allocated_capacity = *psVar7;
      local_d0.field_2._8_8_ = plVar5[3];
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar7;
      local_d0._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_d0._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    Compiler::evaluateBracket(this_00,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar1) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    genMathSubtract(this,2);
    genDynamicCloneTop(this);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
  }
  else {
    pVVar6 = VirtualStack::getVariable(&this->super_VirtualStack,stackPos);
    if (pVVar6->isArray == true) {
      if (pVVar6->arrayLength != 0) {
        uVar8 = 0;
        do {
          genCloneTop(this,stackPos);
          uVar8 = uVar8 + 1;
        } while (uVar8 < pVVar6->arrayLength);
      }
    }
    else {
      genCloneTop(this,stackPos);
    }
  }
  return;
}

Assistant:

void InstructionGenerator::genCloneTop(const std::string &varName)
{
    int varPos = isVariable(varName);
    if(varPos < 0)
        throw std::string("Undefined variable '" + varName + "'");
    else
    {
        if(parser.isArrayDefinition(varName)) //Check if the variable is an array to calculate element offset
        {
            //Split array definition into name and size
            std::string arrayName;
            std::string arrayIndex;
            parser.splitArrayDefinition(varName, arrayName, arrayIndex);

            //Push array base position to stack
            genCreateInt("", static_cast<unsigned int>(isVariable(arrayName)+1));

            //Push index value to stack
            compiler->evaluateBracket("(" + arrayIndex + ")");

            //Subtract them to calculate offset
            genMathSubtract(2);

            //Dynamic clone top the calculated offset to the top
            genDynamicCloneTop();
        }
        else //Else if not an array element
        {
            //Check if we're moving a whole array
            Variable &var = getVariable(varPos);
            if(var.isArray) //We're moving a whole array
            {
                for(unsigned int a = 0; a < var.arrayLength; a++)
                {
                    genCloneTop(varPos); //We can keep using varPos repeatedly as the offset of the next variable is changed by pushing more things to the stack
                }
            }
            else //We're moving a single variable
            {
                genCloneTop(varPos);
            }
        }
    }
}